

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.hpp
# Opt level: O0

void __thiscall pstore::basic_logger::basic_logger(basic_logger *this)

{
  basic_logger *this_local;
  
  logger::logger(&this->super_logger);
  (this->super_logger)._vptr_logger = (_func_int **)&PTR__basic_logger_0019e6c0;
  get_current_thread_name_abi_cxx11_();
  return;
}

Assistant:

basic_logger () = default;